

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O3

void __thiscall mxx::rangebuf::rangebuf(rangebuf *this,streampos start,size_t size,streambuf *sbuf)

{
  char *pcVar1;
  
  *(code **)this = __assert_fail;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0;
  std::locale::locale((locale *)&this->field_0x38);
  *(undefined ***)this = &PTR__rangebuf_00150440;
  this->size_ = size;
  this->sbuf_ = sbuf;
  pcVar1 = (char *)operator_new__(0x40);
  this->buf_ = pcVar1;
  (**(code **)(*(long *)sbuf + 0x28))(sbuf,start._M_off,start._M_state,8);
  return;
}

Assistant:

rangebuf(std::streampos start,
                    size_t size,
                    std::streambuf* sbuf):
        size_(size), sbuf_(sbuf), buf_(new char[64])
    {
        sbuf->pubseekpos(start, std::ios_base::in);
    }